

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          StructNew *curr)

{
  pointer this_00;
  Flow *pFVar1;
  ulong uVar2;
  Struct *pSVar3;
  pointer pFVar4;
  Literal *pLVar5;
  HeapType type;
  anon_union_16_5_9943fe1e_for_Literal_0 *this_01;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  HeapType local_108;
  HeapType heapType;
  anon_union_16_5_9943fe1e_for_Literal_0 local_e8;
  Literal local_d0;
  undefined1 local_b8 [8];
  Literals data;
  shared_ptr<wasm::GCData> local_78;
  StructNew *local_68;
  anon_union_16_5_9943fe1e_for_Literal_0 *local_60;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *local_58;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *local_50;
  Struct *local_48;
  Flow *local_40;
  undefined1 local_31;
  
  local_68 = curr;
  local_50 = this;
  local_40 = __return_storage_ptr__;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id != 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&(curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type;
    local_108 = wasm::Type::getHeapType
                          ((Type *)data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar3 = HeapType::getStruct(&local_108);
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_b8,
               (long)(pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4);
    pFVar4 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48 = pSVar3;
    if ((pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar4) {
      local_58 = &(local_40->values).super_SmallVector<wasm::Literal,_1UL>.flexible;
      local_60 = (anon_union_16_5_9943fe1e_for_Literal_0 *)
                 &(local_40->values).super_SmallVector<wasm::Literal,_1UL>.fixed;
      uVar2 = 1;
      uVar8 = 0;
      do {
        uVar7 = uVar2;
        pFVar1 = local_40;
        iVar6 = (int)uVar7;
        if ((local_68->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            == 0) {
          Literal::makeZero((Literal *)&local_e8.func,(Type)pFVar4[uVar8].type.id);
          pLVar5 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   uVar8 * 0x18);
          if (iVar6 == 1) {
            pLVar5 = (Literal *)&data;
          }
          Literal::operator=(pLVar5,(Literal *)&local_e8.func);
          this_01 = &local_e8;
        }
        else {
          if ((local_68->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar8) goto LAB_008464b8;
          visit(local_40,local_50,
                (local_68->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                [uVar8]);
          if ((pFVar1->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_0084647e;
          pLVar5 = Flow::getSingleValue(pFVar1);
          Literal::Literal((Literal *)&heapType,pLVar5);
          truncateForPacking((Literal *)&local_e8.func,local_50,(Literal *)&heapType,pFVar4 + uVar8)
          ;
          pLVar5 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   uVar8 * 0x18);
          if (iVar6 == 1) {
            pLVar5 = (Literal *)&data;
          }
          Literal::operator=(pLVar5,(Literal *)&local_e8.func);
          Literal::~Literal((Literal *)&local_e8.func);
          Literal::~Literal((Literal *)&heapType);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_58);
          this_01 = local_60;
        }
        Literal::~Literal((Literal *)&this_01->func);
        pFVar4 = (local_48->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = (ulong)(iVar6 + 1);
        uVar8 = uVar7;
      } while (uVar7 < (ulong)((long)(local_48->fields).
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 4))
      ;
    }
    this_00 = data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_e8.i64 = (int64_t)wasm::Type::getHeapType
                                      ((Type *)data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_78.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
              (&local_78.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (GCData **)&local_78,(allocator<wasm::GCData> *)&local_31,(HeapType *)&local_e8.func,
               (Literals *)local_b8);
    type = wasm::Type::getHeapType((Type *)this_00);
    pFVar1 = local_40;
    Literal::Literal(&local_d0,&local_78,type);
    Flow::Flow(pFVar1,&local_d0);
    Literal::~Literal(&local_d0);
    if (local_78.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
LAB_0084647e:
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&data);
    return local_40;
  }
  local_48 = (Struct *)
             (curr->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
  ;
  bVar9 = local_48 == (Struct *)0x0;
  if (!bVar9) {
    pSVar3 = (Struct *)0x0;
    do {
      if ((Struct *)
          (local_68->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          pSVar3) {
LAB_008464b8:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(__return_storage_ptr__,local_50,
            (local_68->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
            [(long)pSVar3]);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
        if (!bVar9) {
          return local_40;
        }
        break;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      Literal::~Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems);
      pSVar3 = (Struct *)
               ((long)&(pSVar3->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
      bVar9 = local_48 == pSVar3;
    } while (!bVar9);
  }
  handle_unreachable("unreachable but no unreachable child",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                     ,0x602);
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }